

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupByState.hpp
# Opt level: O2

void __thiscall
linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>::Init
          (GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int> *this)

{
  bool bVar1;
  mapped_type *this_00;
  iterator __begin0;
  iterator __end0;
  key_type_conflict local_9d;
  int local_9c;
  GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int> *local_98;
  iterator local_90;
  iterator local_70;
  iterator local_50;
  
  (**((this->source).source.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr)->_vptr_IState)();
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::clear(&(this->result)._M_t);
  IEnumerableCore<linq::IEnumerable<int>_>::begin(&local_90,&this->source);
  IEnumerableCore<linq::IEnumerable<int>_>::end(&local_70,&this->source);
  local_98 = this;
  while( true ) {
    IEnumerableCore<linq::IEnumerable<int>_>::iterator::iterator(&local_50,&local_70);
    bVar1 = IEnumerableCore<linq::IEnumerable<int>_>::iterator::operator!=(&local_90,&local_50);
    IEnumerable<int>::~IEnumerable(&local_50.source);
    if (!bVar1) break;
    local_9c = (*(local_90.source.state.
                  super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 _vptr_IState[3])();
    local_9d = std::function<bool_(const_int_&)>::operator()(&this->transformer,&local_9c);
    this_00 = std::
              map<bool,_std::vector<int,_std::allocator<int>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[](&this->result,&local_9d);
    std::vector<int,_std::allocator<int>_>::push_back(this_00,&local_9c);
    IEnumerableCore<linq::IEnumerable<int>_>::iterator::operator++(&local_90);
  }
  IEnumerable<int>::~IEnumerable(&local_70.source);
  IEnumerable<int>::~IEnumerable(&local_90.source);
  (local_98->current)._M_node =
       (local_98->result)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  return;
}

Assistant:

void Init() override 
			{
				source.Init();
				result.clear();
				
				for(const auto& x : source)
					result[transformer(x)].push_back(x);
				
				current = result.begin();
			}